

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmathlib.c
# Opt level: O0

int math_log(lua_State *L)

{
  int iVar1;
  lua_Number __x;
  lua_Number __x_00;
  double dVar2;
  double dVar3;
  lua_Number base;
  lua_Number res;
  lua_Number x;
  lua_State *L_local;
  
  __x = luaL_checknumber(L,1);
  iVar1 = lua_type(L,2);
  if (iVar1 < 1) {
    base = log(__x);
  }
  else {
    __x_00 = luaL_checknumber(L,2);
    if ((__x_00 != 2.0) || (NAN(__x_00))) {
      if ((__x_00 != 10.0) || (NAN(__x_00))) {
        dVar2 = log(__x);
        dVar3 = log(__x_00);
        base = dVar2 / dVar3;
      }
      else {
        base = log10(__x);
      }
    }
    else {
      base = log2(__x);
    }
  }
  lua_pushnumber(L,base);
  return 1;
}

Assistant:

static int math_log(lua_State *L) {
    lua_Number x = luaL_checknumber(L, 1);
    lua_Number res;
    if (lua_isnoneornil(L, 2))
        res = l_mathop(log)(x);
    else {
        lua_Number base = luaL_checknumber(L, 2);
#if !defined(LUA_USE_C89)
        if (base == l_mathop(2.0))
            res = l_mathop(log2)(x);
        else
#endif
        if (base == l_mathop(10.0))
            res = l_mathop(log10)(x);
        else
            res = l_mathop(log)(x) / l_mathop(log)(base);
    }
    lua_pushnumber(L, res);
    return 1;
}